

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

void __thiscall QHttpNetworkReply::ignoreSslErrors(QHttpNetworkReply *this,QList<QSslError> *errors)

{
  bool bVar1;
  undefined8 in_RSI;
  QList<QSslError> *in_RDI;
  QHttpNetworkReplyPrivate *d;
  int channel;
  
  channel = (int)((ulong)in_RSI >> 0x20);
  d_func((QHttpNetworkReply *)0x306c8c);
  bVar1 = QPointer::operator_cast_to_bool((QPointer<QHttpNetworkConnection> *)0x306ca0);
  if (bVar1) {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x306cb6);
    QHttpNetworkConnection::ignoreSslErrors((QHttpNetworkConnection *)d,in_RDI,channel);
  }
  return;
}

Assistant:

void QHttpNetworkReply::ignoreSslErrors(const QList<QSslError> &errors)
{
    Q_D(QHttpNetworkReply);
    if (d->connection)
        d->connection->ignoreSslErrors(errors);
}